

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::~ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
                   *this)

{
  StringSerialiser *__ptr;
  pointer puVar1;
  CCITT *pCVar2;
  pointer pWVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FIRFilter *__ptr_00;
  pointer psVar4;
  Flywheel *pFVar5;
  pointer pMVar6;
  long lVar7;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005a4d88;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005a4e80;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005a4eb8;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_005a4ed0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005a4ee8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a4f00;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a4f30;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_005a4f70;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_005a4f90;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_005a4fa8;
  (this->super_Delegate).super_Delegate._vptr_Delegate = (_func_int **)&DAT_005a4fc0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005a4fe0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005a4ff8;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_005a5018;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  __ptr = (this->string_serialiser_)._M_t.
          super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
          ._M_t.
          super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
          .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
  if (__ptr != (StringSerialiser *)0x0) {
    std::default_delete<Utility::StringSerialiser>::operator()
              ((default_delete<Utility::StringSerialiser> *)&this->string_serialiser_,__ptr);
  }
  (this->string_serialiser_)._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  puVar1 = (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->pravetz_rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->diskii_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_005a4138;
  (this->diskii_).object_.super_EventDelegate._vptr_EventDelegate =
       (_func_int **)&PTR_process_event_00597c98;
  (this->diskii_).object_.super_Source._vptr_Source = (_func_int **)&DAT_00597cd0;
  (this->diskii_).object_.super_Observer._vptr_Observer = (_func_int **)&DAT_00597ce8;
  lVar7 = 0;
  do {
    Storage::Disk::Drive::~Drive((Drive *)(&(this->diskii_).object_.field_0x2b0 + lVar7));
    lVar7 = lVar7 + -0x170;
  } while (lVar7 != -0x2e0);
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.super_Source
  ._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9f88;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9fd8;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005aa000;
  pCVar2 = (this->bd500_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.shifter_.owned_crc_generator_
  ._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
  super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.super_Source
  ._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9eb8;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9f00;
  (this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a9f28;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
             drives_);
  Storage::Disk::Drive::~Drive
            (&(this->bd500_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
              empty_drive_);
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9f88;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9fd8;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005aa000;
  pCVar2 = (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.shifter_.
  owned_crc_generator_._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t
  .super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9eb8;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9f00;
  (this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a9f28;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
             drives_);
  Storage::Disk::Drive::~Drive
            (&(this->jasmin_).super_DiskController.super_WD1770.super_MFMController.super_Controller
              .empty_drive_);
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9f88;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9fd8;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005aa000;
  pCVar2 = (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.shifter_.
           owned_crc_generator_._M_t.
           super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t.
           super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
           super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl;
  if (pCVar2 != (CCITT *)0x0) {
    operator_delete(pCVar2,0x202);
  }
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.shifter_.
  owned_crc_generator_._M_t.super___uniq_ptr_impl<CRC::CCITT,_std::default_delete<CRC::CCITT>_>._M_t
  .super__Tuple_impl<0UL,_CRC::CCITT_*,_std::default_delete<CRC::CCITT>_>.
  super__Head_base<0UL,_CRC::CCITT_*,_false>._M_head_impl = (CCITT *)0x0;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a9eb8;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_EventDelegate._vptr_EventDelegate = (_func_int **)&PTR_process_event_005a9f00;
  (this->microdisc_).super_DiskController.super_WD1770.super_MFMController.super_Controller.
  super_Observer._vptr_Observer = (_func_int **)&DAT_005a9f28;
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::~vector(&(this->microdisc_).super_DiskController.super_WD1770.super_MFMController.
             super_Controller.drives_);
  Storage::Disk::Drive::~Drive
            (&(this->microdisc_).super_DiskController.super_WD1770.super_MFMController.
              super_Controller.empty_drive_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->via_port_handler_).joysticks_);
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_005a4058;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_005a4098;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  super_Parser<Storage::Tape::Oric::SymbolType>._vptr_Parser =
       (_func_int **)&PTR___cxa_pure_virtual_00595170;
  pWVar3 = (this->tape_player_).parser_.
           super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>
           .wave_queue_.
           super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pWVar3 != (pointer)0x0) {
    operator_delete(pWVar3,(long)*(pointer *)
                                  ((long)&(this->tape_player_).parser_.
                                          super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>
                                          .wave_queue_.
                                          super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pWVar3);
  }
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_005aba68;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_005abaa8;
  this_00 = (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.tape_.
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_0059e1d0;
  __ptr_00 = (this->speaker_).
             super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
             filter_._M_t.
             super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
             .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  if (__ptr_00 != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)
               &(this->speaker_).
                super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                .filter_,__ptr_00);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.filter_._M_t
  .
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                 .output_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)(this->speaker_).
                                 super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                 .input_buffer_.super__Vector_base<short,_std::allocator<short>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar4);
  }
  (this->speaker_).
  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__Speaker_00593c18;
  psVar4 = (this->speaker_).
           super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>.
           super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)*(pointer *)
                                  ((long)&(this->speaker_).
                                          super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                                          .super_Speaker.mix_buffer_.
                                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)psVar4);
  }
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_005a4028;
  pFVar5 = (this->video_).object_.crt_.vertical_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->video_).object_.crt_.vertical_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  pFVar5 = (this->video_).object_.crt_.horizontal_flywheel_._M_t.
           super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
           ._M_t.
           super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
           .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
  if (pFVar5 != (Flywheel *)0x0) {
    operator_delete(pFVar5,0x24);
  }
  (this->video_).object_.crt_.horizontal_flywheel_._M_t.
  super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t.
  super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
  super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl = (Flywheel *)0x0;
  puVar1 = (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->disk_rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->rom_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pMVar6 = (this->m6502_).
           super_Processor<Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>,_false>
           .super_ProcessorBase.super_ProcessorStorage.micro_ops_.
           super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar6 != (pointer)0x0) {
    operator_delete(pMVar6,(long)*(pointer *)
                                  ((long)&(this->m6502_).
                                          super_Processor<Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>,_false>
                                          .super_ProcessorBase.super_ProcessorStorage.micro_ops_.
                                          super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                                          ._M_impl + 0x10) - (long)pMVar6);
  }
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a16c0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a16f0;
  Inputs::Keyboard::~Keyboard(&(this->super_MappedKeyboardMachine).keyboard_);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}